

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

int __thiscall
zmq::options_t::setsockopt
          (options_t *this,int __fd,int __level,int __optname,void *__optval,socklen_t __optlen)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  int *piVar5;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var6;
  uchar *bytes_1;
  uchar *bytes;
  string val;
  string key;
  size_t pos;
  string s;
  tcp_address_mask_t mask;
  int rc_1;
  string filter_str;
  int rc;
  bool value_1;
  int value;
  bool is_int;
  string *in_stack_fffffffffffffd78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffda0;
  allocator_type *in_stack_fffffffffffffda8;
  allocator_type *__a;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  uchar *in_stack_fffffffffffffdb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffdc0;
  undefined1 local_1d8 [39];
  undefined1 in_stack_fffffffffffffe4f;
  char *in_stack_fffffffffffffe50;
  tcp_address_mask_t *in_stack_fffffffffffffe58;
  undefined1 local_198 [31];
  allocator_type local_179 [25];
  int *local_160;
  int local_154;
  _Base_ptr local_150;
  undefined1 local_148;
  string local_100 [32];
  string local_e0 [32];
  long local_c0;
  allocator local_b1;
  string local_b0 [84];
  int local_5c;
  string local_58 [39];
  byte local_31;
  int local_30;
  undefined1 local_29;
  ulong local_28;
  int *local_20;
  int local_14;
  options_t *local_10;
  int local_4;
  
  local_160 = (int *)CONCAT44(in_register_00000014,__level);
  uVar4 = CONCAT44(in_register_0000000c,__optname);
  local_29 = uVar4 == 4;
  local_30 = 0;
  if ((bool)local_29) {
    local_30 = *local_160;
  }
  local_28 = uVar4;
  local_20 = local_160;
  local_14 = __fd;
  local_10 = this;
  switch(__fd) {
  case 4:
    iVar1 = do_setsockopt<unsigned_long>
                      (in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                       (unsigned_long *)in_stack_fffffffffffffd78);
    return iVar1;
  case 5:
    if ((uVar4 != 0) && (uVar4 < 0x100)) {
      this->routing_id_size = (uchar)__optname;
      memcpy(this->routing_id,local_160,(ulong)this->routing_id_size);
      return 0;
    }
    break;
  default:
    break;
  case 8:
    if (((bool)local_29) && (0 < local_30)) {
      this->rate = local_30;
      return 0;
    }
    break;
  case 9:
    if (((bool)local_29) && (-1 < local_30)) {
      this->recovery_ivl = local_30;
      return 0;
    }
    break;
  case 0xb:
    if (((bool)local_29) && (-2 < local_30)) {
      this->sndbuf = local_30;
      return 0;
    }
    break;
  case 0xc:
    if (((bool)local_29) && (-2 < local_30)) {
      this->rcvbuf = local_30;
      return 0;
    }
    break;
  case 0x11:
    if (((bool)local_29) && (-2 < local_30)) {
      atomic_value_t::store
                ((atomic_value_t *)in_stack_fffffffffffffd88,
                 (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      return 0;
    }
    break;
  case 0x12:
    if (((bool)local_29) && (-2 < local_30)) {
      this->reconnect_ivl = local_30;
      return 0;
    }
    break;
  case 0x13:
    if (((bool)local_29) && (-1 < local_30)) {
      this->backlog = local_30;
      return 0;
    }
    break;
  case 0x15:
    if (((bool)local_29) && (-1 < local_30)) {
      this->reconnect_ivl_max = local_30;
      return 0;
    }
    break;
  case 0x16:
    iVar1 = do_setsockopt<long>(in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                                (long *)in_stack_fffffffffffffd78);
    return iVar1;
  case 0x17:
    if (((bool)local_29) && (-1 < local_30)) {
      this->sndhwm = local_30;
      return 0;
    }
    break;
  case 0x18:
    if (((bool)local_29) && (-1 < local_30)) {
      this->rcvhwm = local_30;
      return 0;
    }
    break;
  case 0x19:
    if (((bool)local_29) && (0 < local_30)) {
      this->multicast_hops = local_30;
      return 0;
    }
    break;
  case 0x1b:
    if (((bool)local_29) && (-2 < local_30)) {
      this->rcvtimeo = local_30;
      return 0;
    }
    break;
  case 0x1c:
    if (((bool)local_29) && (-2 < local_30)) {
      this->sndtimeo = local_30;
      return 0;
    }
    break;
  case 0x1f:
    iVar1 = do_setsockopt_int_as_bool_strict
                      (in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                       (bool *)in_stack_fffffffffffffd78);
    if (iVar1 != 0) {
      return iVar1;
    }
    this->ipv6 = (bool)((local_31 ^ 0xff) & 1);
    return 0;
  case 0x22:
    if (((bool)local_29) && (((local_30 == -1 || (local_30 == 0)) || (local_30 == 1)))) {
      this->tcp_keepalive = local_30;
      return 0;
    }
    break;
  case 0x23:
    if (((bool)local_29) && ((local_30 == -1 || (-1 < local_30)))) {
      this->tcp_keepalive_cnt = local_30;
      return 0;
    }
    break;
  case 0x24:
    if (((bool)local_29) && ((local_30 == -1 || (-1 < local_30)))) {
      this->tcp_keepalive_idle = local_30;
      return 0;
    }
    break;
  case 0x25:
    if (((bool)local_29) && ((local_30 == -1 || (-1 < local_30)))) {
      this->tcp_keepalive_intvl = local_30;
      return 0;
    }
    break;
  case 0x26:
    std::__cxx11::string::string(local_58);
    local_5c = do_setsockopt_string_allow_empty_strict
                         (in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                          in_stack_fffffffffffffd78,0x2bb5a9);
    if (local_5c == 0) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        tcp_address_mask_t::tcp_address_mask_t((tcp_address_mask_t *)0x2bb62d);
        std::__cxx11::string::c_str();
        local_5c = tcp_address_mask_t::resolve
                             (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                              (bool)in_stack_fffffffffffffe4f);
        if (local_5c == 0) {
          std::vector<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>::push_back
                    ((vector<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_> *)
                     in_stack_fffffffffffffd90,(value_type *)in_stack_fffffffffffffd88);
        }
      }
      else {
        std::vector<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>::clear
                  ((vector<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_> *)
                   0x2bb5f5);
      }
    }
    local_4 = local_5c;
    std::__cxx11::string::~string(local_58);
    return local_4;
  case 0x27:
    if (((bool)local_29) && ((local_30 == 0 || (local_30 == 1)))) {
      this->immediate = local_30;
      return 0;
    }
    break;
  case 0x2a:
    iVar1 = do_setsockopt_int_as_bool_strict
                      (in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                       (bool *)in_stack_fffffffffffffd78);
    return iVar1;
  case 0x2c:
    if (((bool)local_29) && ((local_30 == 0 || (local_30 == 1)))) {
      this->as_server = local_30;
      this->mechanism = (uint)(local_30 != 0);
      return 0;
    }
    break;
  case 0x2d:
    if ((uVar4 == 0) && (local_160 == (int *)0x0)) {
      this->mechanism = 0;
      return 0;
    }
    if (((uVar4 != 0) && (uVar4 < 0x100)) && (local_160 != (int *)0x0)) {
      std::__cxx11::string::assign((char *)&this->plain_username,(ulong)local_160);
      this->as_server = 0;
      this->mechanism = 1;
      return 0;
    }
    break;
  case 0x2e:
    if ((uVar4 == 0) && (local_160 == (int *)0x0)) {
      this->mechanism = 0;
      return 0;
    }
    if (((uVar4 != 0) && (uVar4 < 0x100)) && (local_160 != (int *)0x0)) {
      std::__cxx11::string::assign((char *)&this->plain_password,(ulong)local_160);
      this->as_server = 0;
      this->mechanism = 1;
      return 0;
    }
    break;
  case 0x36:
    iVar1 = do_setsockopt_int_as_bool_strict
                      (in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                       (bool *)in_stack_fffffffffffffd78);
    return iVar1;
  case 0x37:
    iVar1 = do_setsockopt_string_allow_empty_relaxed
                      (in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                       in_stack_fffffffffffffd78,0x2bb944);
    return iVar1;
  case 0x39:
    if (((bool)local_29) && (-1 < local_30)) {
      this->tos = local_30;
      return 0;
    }
    break;
  case 0x3a:
    iVar1 = do_setsockopt_set<int>
                      (in_stack_fffffffffffffd98,(size_t)in_stack_fffffffffffffd90,
                       (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffd88);
    return iVar1;
  case 0x3b:
    iVar1 = do_setsockopt_set<unsigned_int>
                      (in_stack_fffffffffffffd98,(size_t)in_stack_fffffffffffffd90,
                       (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffffd88);
    return iVar1;
  case 0x3c:
    iVar1 = do_setsockopt_set<unsigned_int>
                      (in_stack_fffffffffffffd98,(size_t)in_stack_fffffffffffffd90,
                       (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffffd88);
    return iVar1;
  case 0x42:
    if (((bool)local_29) && (-1 < local_30)) {
      this->handshake_ivl = local_30;
      return 0;
    }
    break;
  case 0x44:
    iVar1 = do_setsockopt_string_allow_empty_strict
                      (in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                       in_stack_fffffffffffffd78,0x2bb316);
    return iVar1;
  case 0x4a:
    iVar1 = do_setsockopt_int_as_bool_relaxed
                      (in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                       (bool *)in_stack_fffffffffffffd78);
    return iVar1;
  case 0x4b:
    if (((bool)local_29) && (-1 < local_30)) {
      this->heartbeat_interval = local_30;
      return 0;
    }
    break;
  case 0x4c:
    local_30 = local_30 / 100;
    if ((((bool)local_29) && (-1 < local_30)) && (local_30 < 0x10000)) {
      this->heartbeat_ttl = (uint16_t)local_30;
      return 0;
    }
    break;
  case 0x4d:
    if (((bool)local_29) && (-1 < local_30)) {
      this->heartbeat_timeout = local_30;
      return 0;
    }
    break;
  case 0x4f:
    if (((bool)local_29) && (-1 < local_30)) {
      this->connect_timeout = local_30;
      return 0;
    }
    break;
  case 0x50:
    if (((bool)local_29) && (-1 < local_30)) {
      this->tcp_maxrt = local_30;
      return 0;
    }
    break;
  case 0x54:
    if (((bool)local_29) && (0 < local_30)) {
      this->multicast_maxtpdu = local_30;
      return 0;
    }
    break;
  case 0x59:
    if (((bool)local_29) && (-2 < local_30)) {
      this->use_fd = local_30;
      return 0;
    }
    break;
  case 0x5c:
    iVar1 = do_setsockopt_string_allow_empty_strict
                      (in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                       in_stack_fffffffffffffd78,0x2bbb33);
    return iVar1;
  case 0x5d:
    iVar1 = do_setsockopt_int_as_bool_relaxed
                      (in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                       (bool *)in_stack_fffffffffffffd78);
    return iVar1;
  case 0x5e:
    iVar1 = do_setsockopt_int_as_bool_relaxed
                      (in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                       (bool *)in_stack_fffffffffffffd78);
    return iVar1;
  case 0x5f:
    if ((uVar4 == 0) || ((bool)local_29)) goto LAB_002bbed9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,(char *)local_160,uVar4,&local_b1);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    lVar2 = std::__cxx11::string::find((char)local_b0,0x3a);
    local_c0 = lVar2;
    if ((lVar2 == -1) ||
       ((lVar2 == 0 || (lVar3 = std::__cxx11::string::length(), lVar2 == lVar3 + -1)))) {
LAB_002bbe9b:
      local_154 = 0;
    }
    else {
      std::__cxx11::string::substr((ulong)local_e0,(ulong)local_b0);
      iVar1 = std::__cxx11::string::compare((ulong)local_e0,0,(char *)0x2);
      if ((iVar1 == 0) && (uVar4 = std::__cxx11::string::length(), uVar4 < 0x100)) {
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_100,(ulong)local_b0);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
        _Var6 = std::
                map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        local_150 = (_Base_ptr)_Var6.first._M_node;
        local_148 = _Var6.second;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(in_stack_fffffffffffffd80);
        local_4 = 0;
        local_154 = 1;
        std::__cxx11::string::~string(local_100);
      }
      else {
        local_154 = 0;
      }
      std::__cxx11::string::~string(local_e0);
      if (local_154 == 0) goto LAB_002bbe9b;
    }
    std::__cxx11::string::~string(local_b0);
    if (local_154 != 0) {
      return local_4;
    }
LAB_002bbed9:
    piVar5 = __errno_location();
    *piVar5 = 0x16;
    return -1;
  case 0x60:
    iVar1 = do_setsockopt_int_as_bool_relaxed
                      (in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                       (bool *)in_stack_fffffffffffffd78);
    return iVar1;
  case 99:
    if ((local_160 != (int *)0x0) && (uVar4 != 0)) {
      iVar1 = do_setsockopt_string_allow_empty_strict
                        (in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                         in_stack_fffffffffffffd78,0x2bb385);
      return iVar1;
    }
    std::__cxx11::string::clear();
    return 0;
  case 100:
    if ((local_160 != (int *)0x0) && (uVar4 != 0)) {
      iVar1 = do_setsockopt_string_allow_empty_strict
                        (in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                         in_stack_fffffffffffffd78,0x2bb3f4);
      return iVar1;
    }
    std::__cxx11::string::clear();
    return 0;
  case 0x65:
    if (((bool)local_29) && (0 < local_30)) {
      this->in_batch_size = local_30;
      return 0;
    }
    break;
  case 0x66:
    if (((bool)local_29) && (0 < local_30)) {
      this->out_batch_size = local_30;
      return 0;
    }
    break;
  case 0x6d:
    if ((bool)local_29) {
      this->reconnect_stop = local_30;
      return 0;
    }
    break;
  case 0x6e:
    if (uVar4 == 0) {
      memset(local_198,0,0x18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2bc08b);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd90,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd88)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd90)
      ;
    }
    else {
      __a = local_179;
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x2bbfee);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 (uchar *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),__a);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd90,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd88)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd90)
      ;
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2bc042);
    }
    return 0;
  case 0x6f:
    if (uVar4 == 0) {
      memset(local_1d8,0,0x18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2bc1af);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd90,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd88)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd90)
      ;
    }
    else {
      __x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)local_160 + uVar4);
      this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_1d8 + 0x1f);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x2bc112);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 (uchar *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                 in_stack_fffffffffffffda8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this_00,__x);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2bc166);
    }
    return 0;
  case 0x70:
    if (((bool)local_29) && (-1 < local_30)) {
      this->priority = local_30;
      return 0;
    }
  }
  piVar5 = __errno_location();
  *piVar5 = 0x16;
  return -1;
}

Assistant:

int zmq::options_t::setsockopt (int option_,
                                const void *optval_,
                                size_t optvallen_)
{
    const bool is_int = (optvallen_ == sizeof (int));
    int value = 0;
    if (is_int)
        memcpy (&value, optval_, sizeof (int));
#if defined(ZMQ_ACT_MILITANT)
    bool malformed = true; //  Did caller pass a bad option value?
#endif

    switch (option_) {
        case ZMQ_SNDHWM:
            if (is_int && value >= 0) {
                sndhwm = value;
                return 0;
            }
            break;

        case ZMQ_RCVHWM:
            if (is_int && value >= 0) {
                rcvhwm = value;
                return 0;
            }
            break;

        case ZMQ_AFFINITY:
            return do_setsockopt (optval_, optvallen_, &affinity);

        case ZMQ_ROUTING_ID:
            //  Routing id is any binary string from 1 to 255 octets
            if (optvallen_ > 0 && optvallen_ <= UCHAR_MAX) {
                routing_id_size = static_cast<unsigned char> (optvallen_);
                memcpy (routing_id, optval_, routing_id_size);
                return 0;
            }
            break;

        case ZMQ_RATE:
            if (is_int && value > 0) {
                rate = value;
                return 0;
            }
            break;

        case ZMQ_RECOVERY_IVL:
            if (is_int && value >= 0) {
                recovery_ivl = value;
                return 0;
            }
            break;

        case ZMQ_SNDBUF:
            if (is_int && value >= -1) {
                sndbuf = value;
                return 0;
            }
            break;

        case ZMQ_RCVBUF:
            if (is_int && value >= -1) {
                rcvbuf = value;
                return 0;
            }
            break;

        case ZMQ_TOS:
            if (is_int && value >= 0) {
                tos = value;
                return 0;
            }
            break;

        case ZMQ_LINGER:
            if (is_int && value >= -1) {
                linger.store (value);
                return 0;
            }
            break;

        case ZMQ_CONNECT_TIMEOUT:
            if (is_int && value >= 0) {
                connect_timeout = value;
                return 0;
            }
            break;

        case ZMQ_TCP_MAXRT:
            if (is_int && value >= 0) {
                tcp_maxrt = value;
                return 0;
            }
            break;

        case ZMQ_RECONNECT_STOP:
            if (is_int) {
                reconnect_stop = value;
                return 0;
            }
            break;

        case ZMQ_RECONNECT_IVL:
            if (is_int && value >= -1) {
                reconnect_ivl = value;
                return 0;
            }
            break;

        case ZMQ_RECONNECT_IVL_MAX:
            if (is_int && value >= 0) {
                reconnect_ivl_max = value;
                return 0;
            }
            break;

        case ZMQ_BACKLOG:
            if (is_int && value >= 0) {
                backlog = value;
                return 0;
            }
            break;

        case ZMQ_MAXMSGSIZE:
            return do_setsockopt (optval_, optvallen_, &maxmsgsize);

        case ZMQ_MULTICAST_HOPS:
            if (is_int && value > 0) {
                multicast_hops = value;
                return 0;
            }
            break;

        case ZMQ_MULTICAST_MAXTPDU:
            if (is_int && value > 0) {
                multicast_maxtpdu = value;
                return 0;
            }
            break;

        case ZMQ_RCVTIMEO:
            if (is_int && value >= -1) {
                rcvtimeo = value;
                return 0;
            }
            break;

        case ZMQ_SNDTIMEO:
            if (is_int && value >= -1) {
                sndtimeo = value;
                return 0;
            }
            break;

        /*  Deprecated in favor of ZMQ_IPV6  */
        case ZMQ_IPV4ONLY: {
            bool value;
            const int rc =
              do_setsockopt_int_as_bool_strict (optval_, optvallen_, &value);
            if (rc == 0)
                ipv6 = !value;
            return rc;
        }

        /*  To replace the somewhat surprising IPV4ONLY */
        case ZMQ_IPV6:
            return do_setsockopt_int_as_bool_strict (optval_, optvallen_,
                                                     &ipv6);

        case ZMQ_SOCKS_PROXY:
            return do_setsockopt_string_allow_empty_strict (
              optval_, optvallen_, &socks_proxy_address, SIZE_MAX);

        case ZMQ_SOCKS_USERNAME:
            /* Make empty string or NULL equivalent. */
            if (optval_ == NULL || optvallen_ == 0) {
                socks_proxy_username.clear ();
                return 0;
            } else {
                return do_setsockopt_string_allow_empty_strict (
                  optval_, optvallen_, &socks_proxy_username, 255);
            }
        case ZMQ_SOCKS_PASSWORD:
            /* Make empty string or NULL equivalent. */
            if (optval_ == NULL || optvallen_ == 0) {
                socks_proxy_password.clear ();
                return 0;
            } else {
                return do_setsockopt_string_allow_empty_strict (
                  optval_, optvallen_, &socks_proxy_password, 255);
            }
        case ZMQ_TCP_KEEPALIVE:
            if (is_int && (value == -1 || value == 0 || value == 1)) {
                tcp_keepalive = value;
                return 0;
            }
            break;

        case ZMQ_TCP_KEEPALIVE_CNT:
            if (is_int && (value == -1 || value >= 0)) {
                tcp_keepalive_cnt = value;
                return 0;
            }
            break;

        case ZMQ_TCP_KEEPALIVE_IDLE:
            if (is_int && (value == -1 || value >= 0)) {
                tcp_keepalive_idle = value;
                return 0;
            }
            break;

        case ZMQ_TCP_KEEPALIVE_INTVL:
            if (is_int && (value == -1 || value >= 0)) {
                tcp_keepalive_intvl = value;
                return 0;
            }
            break;

        case ZMQ_IMMEDIATE:
            // TODO why is immediate not bool (and called non_immediate, as its meaning appears to be reversed)
            if (is_int && (value == 0 || value == 1)) {
                immediate = value;
                return 0;
            }
            break;

        case ZMQ_TCP_ACCEPT_FILTER: {
            std::string filter_str;
            int rc = do_setsockopt_string_allow_empty_strict (
              optval_, optvallen_, &filter_str, UCHAR_MAX);
            if (rc == 0) {
                if (filter_str.empty ()) {
                    tcp_accept_filters.clear ();
                } else {
                    tcp_address_mask_t mask;
                    rc = mask.resolve (filter_str.c_str (), ipv6);
                    if (rc == 0) {
                        tcp_accept_filters.push_back (mask);
                    }
                }
            }
            return rc;
        }

#if defined ZMQ_HAVE_SO_PEERCRED || defined ZMQ_HAVE_LOCAL_PEERCRED
        case ZMQ_IPC_FILTER_UID:
            return do_setsockopt_set (optval_, optvallen_,
                                      &ipc_uid_accept_filters);


        case ZMQ_IPC_FILTER_GID:
            return do_setsockopt_set (optval_, optvallen_,
                                      &ipc_gid_accept_filters);
#endif

#if defined ZMQ_HAVE_SO_PEERCRED
        case ZMQ_IPC_FILTER_PID:
            return do_setsockopt_set (optval_, optvallen_,
                                      &ipc_pid_accept_filters);
#endif

        case ZMQ_PLAIN_SERVER:
            if (is_int && (value == 0 || value == 1)) {
                as_server = value;
                mechanism = value ? ZMQ_PLAIN : ZMQ_NULL;
                return 0;
            }
            break;

        case ZMQ_PLAIN_USERNAME:
            if (optvallen_ == 0 && optval_ == NULL) {
                mechanism = ZMQ_NULL;
                return 0;
            } else if (optvallen_ > 0 && optvallen_ <= UCHAR_MAX
                       && optval_ != NULL) {
                plain_username.assign (static_cast<const char *> (optval_),
                                       optvallen_);
                as_server = 0;
                mechanism = ZMQ_PLAIN;
                return 0;
            }
            break;

        case ZMQ_PLAIN_PASSWORD:
            if (optvallen_ == 0 && optval_ == NULL) {
                mechanism = ZMQ_NULL;
                return 0;
            } else if (optvallen_ > 0 && optvallen_ <= UCHAR_MAX
                       && optval_ != NULL) {
                plain_password.assign (static_cast<const char *> (optval_),
                                       optvallen_);
                as_server = 0;
                mechanism = ZMQ_PLAIN;
                return 0;
            }
            break;

        case ZMQ_ZAP_DOMAIN:
            return do_setsockopt_string_allow_empty_relaxed (
              optval_, optvallen_, &zap_domain, UCHAR_MAX);

            //  If curve encryption isn't built, these options provoke EINVAL
#ifdef ZMQ_HAVE_CURVE
        case ZMQ_CURVE_SERVER:
            if (is_int && (value == 0 || value == 1)) {
                as_server = value;
                mechanism = value ? ZMQ_CURVE : ZMQ_NULL;
                return 0;
            }
            break;

        case ZMQ_CURVE_PUBLICKEY:
            if (0 == set_curve_key (curve_public_key, optval_, optvallen_)) {
                return 0;
            }
            break;

        case ZMQ_CURVE_SECRETKEY:
            if (0 == set_curve_key (curve_secret_key, optval_, optvallen_)) {
                return 0;
            }
            break;

        case ZMQ_CURVE_SERVERKEY:
            if (0 == set_curve_key (curve_server_key, optval_, optvallen_)) {
                as_server = 0;
                return 0;
            }
            break;
#endif

        case ZMQ_CONFLATE:
            return do_setsockopt_int_as_bool_strict (optval_, optvallen_,
                                                     &conflate);

            //  If libgssapi isn't installed, these options provoke EINVAL
#ifdef HAVE_LIBGSSAPI_KRB5
        case ZMQ_GSSAPI_SERVER:
            if (is_int && (value == 0 || value == 1)) {
                as_server = value;
                mechanism = ZMQ_GSSAPI;
                return 0;
            }
            break;

        case ZMQ_GSSAPI_PRINCIPAL:
            if (optvallen_ > 0 && optvallen_ <= UCHAR_MAX && optval_ != NULL) {
                gss_principal.assign ((const char *) optval_, optvallen_);
                mechanism = ZMQ_GSSAPI;
                return 0;
            }
            break;

        case ZMQ_GSSAPI_SERVICE_PRINCIPAL:
            if (optvallen_ > 0 && optvallen_ <= UCHAR_MAX && optval_ != NULL) {
                gss_service_principal.assign ((const char *) optval_,
                                              optvallen_);
                mechanism = ZMQ_GSSAPI;
                as_server = 0;
                return 0;
            }
            break;

        case ZMQ_GSSAPI_PLAINTEXT:
            return do_setsockopt_int_as_bool_strict (optval_, optvallen_,
                                                     &gss_plaintext);

        case ZMQ_GSSAPI_PRINCIPAL_NAMETYPE:
            if (is_int
                && (value == ZMQ_GSSAPI_NT_HOSTBASED
                    || value == ZMQ_GSSAPI_NT_USER_NAME
                    || value == ZMQ_GSSAPI_NT_KRB5_PRINCIPAL)) {
                gss_principal_nt = value;
                return 0;
            }
            break;

        case ZMQ_GSSAPI_SERVICE_PRINCIPAL_NAMETYPE:
            if (is_int
                && (value == ZMQ_GSSAPI_NT_HOSTBASED
                    || value == ZMQ_GSSAPI_NT_USER_NAME
                    || value == ZMQ_GSSAPI_NT_KRB5_PRINCIPAL)) {
                gss_service_principal_nt = value;
                return 0;
            }
            break;
#endif

        case ZMQ_HANDSHAKE_IVL:
            if (is_int && value >= 0) {
                handshake_ivl = value;
                return 0;
            }
            break;

        case ZMQ_INVERT_MATCHING:
            return do_setsockopt_int_as_bool_relaxed (optval_, optvallen_,
                                                      &invert_matching);

        case ZMQ_HEARTBEAT_IVL:
            if (is_int && value >= 0) {
                heartbeat_interval = value;
                return 0;
            }
            break;

        case ZMQ_HEARTBEAT_TTL:
            // Convert this to deciseconds from milliseconds
            value = value / deciseconds_per_millisecond;
            if (is_int && value >= 0 && value <= UINT16_MAX) {
                heartbeat_ttl = static_cast<uint16_t> (value);
                return 0;
            }
            break;

        case ZMQ_HEARTBEAT_TIMEOUT:
            if (is_int && value >= 0) {
                heartbeat_timeout = value;
                return 0;
            }
            break;

#ifdef ZMQ_HAVE_VMCI
        case ZMQ_VMCI_BUFFER_SIZE:
            return do_setsockopt (optval_, optvallen_, &vmci_buffer_size);

        case ZMQ_VMCI_BUFFER_MIN_SIZE:
            return do_setsockopt (optval_, optvallen_, &vmci_buffer_min_size);

        case ZMQ_VMCI_BUFFER_MAX_SIZE:
            return do_setsockopt (optval_, optvallen_, &vmci_buffer_max_size);

        case ZMQ_VMCI_CONNECT_TIMEOUT:
            return do_setsockopt (optval_, optvallen_, &vmci_connect_timeout);
#endif

        case ZMQ_USE_FD:
            if (is_int && value >= -1) {
                use_fd = value;
                return 0;
            }
            break;

        case ZMQ_BINDTODEVICE:
            return do_setsockopt_string_allow_empty_strict (
              optval_, optvallen_, &bound_device, BINDDEVSIZ);

        case ZMQ_ZAP_ENFORCE_DOMAIN:
            return do_setsockopt_int_as_bool_relaxed (optval_, optvallen_,
                                                      &zap_enforce_domain);

        case ZMQ_LOOPBACK_FASTPATH:
            return do_setsockopt_int_as_bool_relaxed (optval_, optvallen_,
                                                      &loopback_fastpath);

        case ZMQ_METADATA:
            if (optvallen_ > 0 && !is_int) {
                const std::string s (static_cast<const char *> (optval_),
                                     optvallen_);
                const size_t pos = s.find (':');
                if (pos != std::string::npos && pos != 0
                    && pos != s.length () - 1) {
                    const std::string key = s.substr (0, pos);
                    if (key.compare (0, 2, "X-") == 0
                        && key.length () <= UCHAR_MAX) {
                        std::string val = s.substr (pos + 1, s.length ());
                        app_metadata.insert (
                          std::pair<std::string, std::string> (key, val));
                        return 0;
                    }
                }
            }
            errno = EINVAL;
            return -1;

        case ZMQ_MULTICAST_LOOP:
            return do_setsockopt_int_as_bool_relaxed (optval_, optvallen_,
                                                      &multicast_loop);

#ifdef ZMQ_BUILD_DRAFT_API
        case ZMQ_IN_BATCH_SIZE:
            if (is_int && value > 0) {
                in_batch_size = value;
                return 0;
            }
            break;

        case ZMQ_OUT_BATCH_SIZE:
            if (is_int && value > 0) {
                out_batch_size = value;
                return 0;
            }
            break;

#ifdef ZMQ_HAVE_WSS
        case ZMQ_WSS_KEY_PEM:
            // TODO: check if valid certificate
            wss_key_pem = std::string ((char *) optval_, optvallen_);
            return 0;
        case ZMQ_WSS_CERT_PEM:
            // TODO: check if valid certificate
            wss_cert_pem = std::string ((char *) optval_, optvallen_);
            return 0;
        case ZMQ_WSS_TRUST_PEM:
            // TODO: check if valid certificate
            wss_trust_pem = std::string ((char *) optval_, optvallen_);
            return 0;
        case ZMQ_WSS_HOSTNAME:
            wss_hostname = std::string ((char *) optval_, optvallen_);
            return 0;
        case ZMQ_WSS_TRUST_SYSTEM:
            return do_setsockopt_int_as_bool_strict (optval_, optvallen_,
                                                     &wss_trust_system);
#endif

        case ZMQ_HELLO_MSG:
            if (optvallen_ > 0) {
                unsigned char *bytes = (unsigned char *) optval_;
                hello_msg =
                  std::vector<unsigned char> (bytes, bytes + optvallen_);
            } else {
                hello_msg = std::vector<unsigned char> ();
            }

            return 0;

        case ZMQ_DISCONNECT_MSG:
            if (optvallen_ > 0) {
                unsigned char *bytes = (unsigned char *) optval_;
                disconnect_msg =
                  std::vector<unsigned char> (bytes, bytes + optvallen_);
            } else {
                disconnect_msg = std::vector<unsigned char> ();
            }

            return 0;

        case ZMQ_PRIORITY:
            if (is_int && value >= 0) {
                priority = value;
                return 0;
            }
            break;

#endif

        default:
#if defined(ZMQ_ACT_MILITANT)
            //  There are valid scenarios for probing with unknown socket option
            //  values, e.g. to check if security is enabled or not. This will not
            //  provoke a militant assert. However, passing bad values to a valid
            //  socket option will, if ZMQ_ACT_MILITANT is defined.
            malformed = false;
#endif
            break;
    }

        // TODO mechanism should either be set explicitly, or determined when
        // connecting. currently, it depends on the order of setsockopt calls
        // if there is some inconsistency, which is confusing. in addition,
        // the assumed or set mechanism should be queryable (as a socket option)

#if defined(ZMQ_ACT_MILITANT)
    //  There is no valid use case for passing an error back to the application
    //  when it sent malformed arguments to a socket option. Use ./configure
    //  --with-militant to enable this checking.
    if (malformed)
        zmq_assert (false);
#endif
    errno = EINVAL;
    return -1;
}